

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void add_child(_node_t *to,_node_t *child)

{
  void *pvVar1;
  void *in_RSI;
  long in_RDI;
  _node_t **new;
  size_t in_stack_ffffffffffffffe8;
  
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  pvVar1 = mrealloc(in_RSI,in_stack_ffffffffffffffe8);
  *(void **)(in_RDI + 0x18) = pvVar1;
  *(void **)(*(long *)(in_RDI + 0x18) + (ulong)(*(int *)(in_RDI + 8) - 1) * 8) = in_RSI;
  *(long *)((long)in_RSI + 0x10) = in_RDI;
  return;
}

Assistant:

void add_child(_node_t* to, _node_t* child)
{
    _node_t** new;
    to->num_children++;
    new =
        (_node_t**)mrealloc(to->children, sizeof(_node_t*) * to->num_children);

    to->children = new;
    to->children[to->num_children - 1] = child;
    child->parent = to;
}